

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DnnTrainer.cpp
# Opt level: O1

void __thiscall tfs::DnnTrainer::setupSums(DnnTrainer *this,bool xsum)

{
  double *pdVar1;
  double *pdVar2;
  Trainable **ppTVar3;
  TMatrix<double> *pTVar4;
  long lVar5;
  unsigned_long aa;
  
  ppTVar3 = this->m_trainable_handle;
  if (ppTVar3 < this->m_trainable_end) {
    aa = 0;
    do {
      pdVar1 = (*ppTVar3)->weightEnd;
      pdVar2 = (*ppTVar3)->weightStart;
      lVar5 = (long)pdVar1 - (long)pdVar2 >> 3;
      if (pdVar1 <= pdVar2) {
        lVar5 = 0;
      }
      ppTVar3 = ppTVar3 + 1;
      aa = aa + lVar5;
    } while (ppTVar3 < this->m_trainable_end);
  }
  else {
    aa = 0;
  }
  pTVar4 = (TMatrix<double> *)operator_new(0x50);
  TMatrix<double>::TMatrix(pTVar4,aa,1,1,1);
  this->m_gsum = pTVar4;
  if ((pTVar4->m_data != (double *)0x0) && (pTVar4->m_length != 0)) {
    memset(pTVar4->m_data,0,pTVar4->m_length);
  }
  if (xsum) {
    pTVar4 = (TMatrix<double> *)operator_new(0x50);
    TMatrix<double>::TMatrix(pTVar4,aa,1,1,1);
    this->m_xsum = pTVar4;
    if ((pTVar4->m_data != (double *)0x0) && (pTVar4->m_length != 0)) {
      memset(pTVar4->m_data,0,pTVar4->m_length);
      return;
    }
  }
  return;
}

Assistant:

void
    DnnTrainer::setupSums( bool xsum ) {
        Trainable **trainableHandle = m_trainable_handle;
        Trainable **trainableEnd    = m_trainable_end;
        unsigned long count         = 0;
        while( trainableHandle < trainableEnd ) {
            Trainable *trainable = *trainableHandle++;
            count += trainable->weightCount();
        }
        m_gsum = new Matrix( count );
        m_gsum->zero();
        if( xsum ) {
            m_xsum = new Matrix( count );
            m_xsum->zero();
        }
        return;
    }